

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::LoadBalanceLevel0(Amr *this,Real time)

{
  pointer pAVar1;
  Amr *in_XMM0_Qa;
  DistributionMapping *dm;
  BoxArray *in_stack_00000560;
  Real in_stack_00000568;
  int in_stack_00000574;
  Amr *in_stack_00000578;
  uint in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  uint uVar2;
  undefined1 local_28 [8];
  DistributionMapping *in_stack_ffffffffffffffe0;
  Amr *this_00;
  
  this_00 = in_XMM0_Qa;
  AmrMesh::boxArray((AmrMesh *)in_XMM0_Qa,in_stack_ffffffffffffffac);
  makeLoadBalanceDistributionMap
            (in_stack_00000578,in_stack_00000574,in_stack_00000568,in_stack_00000560);
  InstallNewDistributionMap(this_00,(int)((ulong)local_28 >> 0x20),in_stack_ffffffffffffffe0);
  uVar2 = 0;
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)in_XMM0_Qa,(ulong)in_stack_ffffffffffffffa8);
  pAVar1 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                     ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                      0x13894b1);
  (*pAVar1->_vptr_AmrLevel[0x13])(pAVar1,(ulong)uVar2);
  DistributionMapping::~DistributionMapping((DistributionMapping *)0x13894d2);
  return;
}

Assistant:

void
Amr::LoadBalanceLevel0 (Real time)
{
    BL_PROFILE("LoadBalanceLevel0()");
    const auto& dm = makeLoadBalanceDistributionMap(0, time, boxArray(0));
    InstallNewDistributionMap(0, dm);
    amr_level[0]->post_regrid(0,0);
}